

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O0

int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl *gel)

{
  undefined4 uVar1;
  ostream *poVar2;
  long *in_RDI;
  int elType;
  MElementType pzElType;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  int local_10;
  
  uVar1 = (**(code **)(*in_RDI + 0xb8))();
  local_10 = -1;
  switch(uVar1) {
  case 0:
    local_10 = 1;
    break;
  case 1:
    local_10 = 3;
    break;
  case 2:
    local_10 = 5;
    break;
  case 3:
    local_10 = 9;
    break;
  case 4:
    local_10 = 10;
    break;
  case 5:
    local_10 = 0xe;
    break;
  case 6:
    local_10 = 0xd;
    break;
  case 7:
    local_10 = 0xc;
    break;
  default:
    poVar2 = std::operator<<((ostream *)&std::cout,"Element type not found on ");
    poVar2 = std::operator<<(poVar2,"static int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl *)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  if (local_10 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Element type not found on ");
    poVar2 = std::operator<<(poVar2,"static int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl *)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "MIGHT BE CURVED ELEMENT (quadratic or quarter point)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  return local_10;
}

Assistant:

int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl * gel) {
    MElementType pzElType = gel->Type();

    int elType = -1;
    switch (pzElType) {
        case(EPoint):
        {
            elType = 1;
            break;
        }
        case(EOned):
        {
            elType = 3;
            break;
        }
        case (ETriangle):
        {
            elType = 5;
            break;
        }
        case (EQuadrilateral):
        {
            elType = 9;
            break;
        }
        case (ETetraedro):
        {
            elType = 10;
            break;
        }
        case (EPiramide):
        {
            elType = 14;
            break;
        }
        case (EPrisma):
        {
            elType = 13;
            break;
        }
        case (ECube):
        {
            elType = 12;
            break;
        }
        default:
        {
            std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
            DebugStop();
            break;
        }
    }
    if (elType == -1) {
        std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
        std::cout << "MIGHT BE CURVED ELEMENT (quadratic or quarter point)" << std::endl;
        DebugStop();
    }

    return elType;
}